

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

size_t sx_os_pagesz(void)

{
  size_t sVar1;
  
  sVar1 = sysconf(0x1e);
  return sVar1;
}

Assistant:

size_t sx_os_pagesz(void)
{
#if SX_PLATFORM_WINDOWS
    SYSTEM_INFO si;
    GetSystemInfo(&si);
    return (size_t)si.dwPageSize;
#elif SX_PLATFORM_POSIX
    return (size_t)sysconf(_SC_PAGESIZE);
#endif
}